

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O2

int ffpcks(fitsfile *fptr,int *status)

{
  double dVar1;
  unsigned_long uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  LONGLONG headstart;
  unsigned_long sum;
  LONGLONG datastart;
  unsigned_long dsum;
  LONGLONG dataend;
  char checksum [71];
  char chkcomm [73];
  char datestr [20];
  char datasum [71];
  char datacomm [73];
  char comm [73];
  
  if (0 < *status) {
    return *status;
  }
  ffgstm(datestr,(int *)0x0,status);
  builtin_strncpy(chkcomm + 0x10,"ated ",6);
  builtin_strncpy(chkcomm,"HDU checksum upd",0x10);
  strcat(chkcomm,datestr);
  builtin_strncpy(datacomm,"data unit checksum updated ",0x1c);
  strcat(datacomm,datestr);
  iVar4 = *status;
  iVar3 = ffgkys(fptr,"CHECKSUM",checksum,comm,status);
  if (iVar3 == 0xca) {
    *status = iVar4;
    builtin_strncpy(checksum,"0000000000000000",0x11);
    ffpkys(fptr,"CHECKSUM",checksum,chkcomm,status);
  }
  iVar4 = *status;
  iVar3 = ffgkys(fptr,"DATASUM",datasum,comm,status);
  if (iVar3 == 0xca) {
    *status = iVar4;
    ffpkys(fptr,"DATASUM","         0",datacomm,status);
    iVar4 = bcmp(checksum,"0000000000000000",0x11);
    if (iVar4 != 0) {
      builtin_strncpy(checksum,"0000000000000000",0x11);
      ffmkys(fptr,"CHECKSUM",checksum,chkcomm,status);
    }
    uVar6 = 0;
  }
  else {
    dVar1 = atof(datasum);
    uVar6 = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
  }
  iVar4 = ffrdef(fptr,status);
  if (iVar4 < 1) {
    if (0 < fptr->Fptr->heapsize) {
      ffuptf(fptr,status);
    }
    iVar4 = ffpdfl(fptr,status);
    if ((iVar4 < 1) && (iVar4 = ffghadll(fptr,&headstart,&datastart,&dataend,status), iVar4 < 1)) {
      uVar5 = dataend - datastart;
      dsum = 0;
      if (0xb3f < (long)uVar5) {
        ffmbyt(fptr,datastart,0,status);
        iVar4 = ffcsum(fptr,uVar5 / 0xb40,&dsum,status);
        if (0 < iVar4) goto LAB_00130734;
      }
      uVar2 = dsum;
      if (dsum != uVar6) {
        snprintf(datasum,0x47,"%lu",dsum);
        ffmkys(fptr,"DATASUM",datasum,datacomm,status);
        iVar4 = bcmp(checksum,"0000000000000000",0x11);
        if (iVar4 != 0) {
          builtin_strncpy(checksum,"0000000000000000",0x11);
          ffmkys(fptr,"CHECKSUM",checksum,chkcomm,status);
        }
      }
      iVar4 = bcmp(checksum,"0000000000000000",0x11);
      if (iVar4 != 0) {
        ffmbyt(fptr,headstart,0,status);
        sum = uVar2;
        iVar4 = ffcsum(fptr,(datastart - headstart) / 0xb40,&sum,status);
        if (((0 < iVar4) || (sum == 0)) || (sum == 0xffffffff)) goto LAB_00130734;
        ffmkys(fptr,"CHECKSUM","0000000000000000",chkcomm,status);
      }
      ffmbyt(fptr,headstart,0,status);
      sum = uVar2;
      iVar4 = ffcsum(fptr,(datastart - headstart) / 0xb40,&sum,status);
      if (iVar4 < 1) {
        ffesum(sum,1,checksum);
        ffmkys(fptr,"CHECKSUM",checksum,"&",status);
      }
    }
  }
LAB_00130734:
  return *status;
}

Assistant:

int ffpcks(fitsfile *fptr,      /* I - FITS file pointer                  */
           int *status)         /* IO - error status                      */
/*
   Create or update the checksum keywords in the CHDU.  These keywords
   provide a checksum verification of the FITS HDU based on the ASCII
   coded 1's complement checksum algorithm developed by Rob Seaman at NOAO.
*/
{
    char datestr[20], checksum[FLEN_VALUE], datasum[FLEN_VALUE];
    char  comm[FLEN_COMMENT], chkcomm[FLEN_COMMENT], datacomm[FLEN_COMMENT];
    int tstatus;
    long nrec;
    LONGLONG headstart, datastart, dataend;
    unsigned long dsum, olddsum, sum;
    double tdouble;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* generate current date string and construct the keyword comments */
    ffgstm(datestr, NULL, status);
    strcpy(chkcomm, "HDU checksum updated ");
    strcat(chkcomm, datestr);
    strcpy(datacomm, "data unit checksum updated ");
    strcat(datacomm, datestr);

    /* write the CHECKSUM keyword if it does not exist */
    tstatus = *status;
    if (ffgkys(fptr, "CHECKSUM", checksum, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        strcpy(checksum, "0000000000000000");
        ffpkys(fptr, "CHECKSUM", checksum, chkcomm, status);
    }

    /* write the DATASUM keyword if it does not exist */
    tstatus = *status;
    if (ffgkys(fptr, "DATASUM", datasum, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        olddsum = 0;
        ffpkys(fptr, "DATASUM", "         0", datacomm, status);

        /* set the CHECKSUM keyword as undefined, if it isn't already */
        if (strcmp(checksum, "0000000000000000") )
        {
            strcpy(checksum, "0000000000000000");
            ffmkys(fptr, "CHECKSUM", checksum, chkcomm, status);
        }
    }
    else
    {
        /* decode the datasum into an unsigned long variable */

        /* olddsum = strtoul(datasum, 0, 10); doesn't work on SUN OS */

        tdouble = atof(datasum);
        olddsum = (unsigned long) tdouble;
    }

    /* close header: rewrite END keyword and following blank fill */
    /* and re-read the required keywords to determine the structure */
    if (ffrdef(fptr, status) > 0)
        return(*status);

    if ((fptr->Fptr)->heapsize > 0)
         ffuptf(fptr, status);  /* update the variable length TFORM values */

    /* write the correct data fill values, if they are not already correct */
    if (ffpdfl(fptr, status) > 0)
        return(*status);

    /* calc size of data unit, in FITS 2880-byte blocks */
    if (ffghadll(fptr, &headstart, &datastart, &dataend, status) > 0)
        return(*status);

    nrec = (long) ((dataend - datastart) / 2880);
    dsum = 0;

    if (nrec > 0)
    {
        /* accumulate the 32-bit 1's complement checksum */
        ffmbyt(fptr, datastart, REPORT_EOF, status);
        if (ffcsum(fptr, nrec, &dsum, status) > 0)
            return(*status);
    }

    if (dsum != olddsum)
    {
        /* update the DATASUM keyword with the correct value */ 
        snprintf(datasum, FLEN_VALUE, "%lu", dsum);
        ffmkys(fptr, "DATASUM", datasum, datacomm, status);

        /* set the CHECKSUM keyword as undefined, if it isn't already */
        if (strcmp(checksum, "0000000000000000") )
        {
            strcpy(checksum, "0000000000000000");
            ffmkys(fptr, "CHECKSUM", checksum, chkcomm, status);
        }
    }        

    if (strcmp(checksum, "0000000000000000") )
    {
        /* check if CHECKSUM is still OK; move to the start of the header */
        ffmbyt(fptr, headstart, REPORT_EOF, status);

        /* accumulate the header checksum into the previous data checksum */
        nrec = (long) ((datastart - headstart) / 2880);
        sum = dsum;
        if (ffcsum(fptr, nrec, &sum, status) > 0)
            return(*status);

        if (sum == 0 || sum == 0xFFFFFFFF)
           return(*status);            /* CHECKSUM is correct */

        /* Zero the CHECKSUM and recompute the new value */
        ffmkys(fptr, "CHECKSUM", "0000000000000000", chkcomm, status);
    }

    /* move to the start of the header */
    ffmbyt(fptr, headstart, REPORT_EOF, status);

    /* accumulate the header checksum into the previous data checksum */
    nrec = (long) ((datastart - headstart) / 2880);
    sum = dsum;
    if (ffcsum(fptr, nrec, &sum, status) > 0)
           return(*status);

    /* encode the COMPLEMENT of the checksum into a 16-character string */
    ffesum(sum, TRUE, checksum);

    /* update the CHECKSUM keyword value with the new string */
    ffmkys(fptr, "CHECKSUM", checksum, "&", status);

    return(*status);
}